

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O3

void Abc_ObjPatchFanoutFanin(Abc_Obj_t *pObj,int iObjNew)

{
  int *piVar1;
  void **ppvVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  if (0 < (pObj->vFanouts).nSize) {
    piVar1 = (pObj->vFanouts).pArray;
    ppvVar2 = pObj->pNtk->vObjs->pArray;
    lVar4 = 0;
    do {
      pvVar3 = ppvVar2[piVar1[lVar4]];
      iVar5 = *(int *)((long)pvVar3 + 0x1c);
      if ((long)iVar5 < 1) {
        lVar6 = 0;
      }
      else {
        lVar6 = 0;
        while (*(int *)(*(long *)((long)pvVar3 + 0x20) + lVar6 * 4) != pObj->Id) {
          lVar6 = lVar6 + 1;
          if (iVar5 == lVar6) goto LAB_0085ceff;
        }
        *(int *)(*(long *)((long)pvVar3 + 0x20) + lVar6 * 4) = iObjNew;
        iVar5 = *(int *)((long)pvVar3 + 0x1c);
      }
      if (iVar5 <= (int)lVar6) {
LAB_0085ceff:
        __assert_fail("k < Vec_IntSize(&pFanout->vFanins)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                      ,0xec,"void Abc_ObjPatchFanoutFanin(Abc_Obj_t *, int)");
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pObj->vFanouts).nSize);
  }
  return;
}

Assistant:

void Abc_ObjPatchFanoutFanin( Abc_Obj_t * pObj, int iObjNew )
{
    Abc_Obj_t * pFanout;
    int i, k, Entry;
    // update fanouts of the node to point to this one
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        Vec_IntForEachEntry( &pFanout->vFanins, Entry, k )
            if ( Entry == (int)Abc_ObjId(pObj) )
            {
                Vec_IntWriteEntry( &pFanout->vFanins, k, iObjNew );
                break;
            }
        assert( k < Vec_IntSize(&pFanout->vFanins) );
    }
}